

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

int glfwInit(void)

{
  int iVar1;
  GLFWbool GVar2;
  int local_10;
  int local_c;
  int i;
  
  if (_glfw.initialized == 0) {
    memset(&_glfw,0,0x21400);
    _glfw.hints.init.hatButtons = _glfwInitHints.hatButtons;
    _glfw.hints.init.angleType = _glfwInitHints.angleType;
    _glfw.hints.init.ns = _glfwInitHints.ns;
    iVar1 = _glfwPlatformInit();
    if (iVar1 == 0) {
      terminate();
      local_c = 0;
    }
    else {
      GVar2 = _glfwPlatformCreateMutex(&_glfw.errorLock);
      if (((GVar2 != 0) && (GVar2 = _glfwPlatformCreateTls(&_glfw.errorSlot), GVar2 != 0)) &&
         (GVar2 = _glfwPlatformCreateTls(&_glfw.contextSlot), GVar2 != 0)) {
        _glfwPlatformSetTls(&_glfw.errorSlot,&_glfwMainThreadError);
        _glfw.initialized = 1;
        _glfw.timer.offset = _glfwPlatformGetTimerValue();
        glfwDefaultWindowHints();
        local_10 = 0;
        while( true ) {
          if (_glfwDefaultMappings[local_10] == (char *)0x0) {
            return 1;
          }
          iVar1 = glfwUpdateGamepadMappings(_glfwDefaultMappings[local_10]);
          if (iVar1 == 0) break;
          local_10 = local_10 + 1;
        }
        terminate();
        return 0;
      }
      terminate();
      local_c = 0;
    }
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfw.initialized)
        return GLFW_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));
    _glfw.hints.init = _glfwInitHints;

    if (!_glfwPlatformInit())
    {
        terminate();
        return GLFW_FALSE;
    }

    if (!_glfwPlatformCreateMutex(&_glfw.errorLock) ||
        !_glfwPlatformCreateTls(&_glfw.errorSlot) ||
        !_glfwPlatformCreateTls(&_glfw.contextSlot))
    {
        terminate();
        return GLFW_FALSE;
    }

    _glfwPlatformSetTls(&_glfw.errorSlot, &_glfwMainThreadError);

    _glfw.initialized = GLFW_TRUE;
    _glfw.timer.offset = _glfwPlatformGetTimerValue();

    glfwDefaultWindowHints();

    {
        int i;

        for (i = 0;  _glfwDefaultMappings[i];  i++)
        {
            if (!glfwUpdateGamepadMappings(_glfwDefaultMappings[i]))
            {
                terminate();
                return GLFW_FALSE;
            }
        }
    }

    return GLFW_TRUE;
}